

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  CollSeq *zP4;
  int iVar1;
  AggInfo_func *pAVar2;
  Expr **ppEVar3;
  int addrRepeat;
  int iVar4;
  int nReg;
  int iVar5;
  ExprList_item *pEVar6;
  int local_54;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  pAVar2 = pAggInfo->aFunc;
  iVar5 = 0;
  for (iVar1 = 0; iVar1 < pAggInfo->nFunc; iVar1 = iVar1 + 1) {
    pList = (pAVar2->pExpr->x).pList;
    addrRepeat = 0;
    nReg = 0;
    local_54 = 0;
    if (pList != (ExprList *)0x0) {
      nReg = pList->nExpr;
      local_54 = sqlite3GetTempRange(pParse,nReg);
      sqlite3ExprCodeExprList(pParse,pList,local_54,0,'\x01');
    }
    iVar4 = pAVar2->iDistinct;
    if (-1 < iVar4) {
      addrRepeat = pParse->nLabel + -1;
      pParse->nLabel = addrRepeat;
      codeDistinct(pParse,iVar4,addrRepeat,1,local_54);
    }
    if ((pAVar2->pFunc->funcFlags & 0x20) != 0) {
      pEVar6 = pList->a;
      zP4 = (CollSeq *)0x0;
      for (iVar4 = 0; (zP4 == (CollSeq *)0x0 && (iVar4 < nReg)); iVar4 = iVar4 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar6->pExpr);
        pEVar6 = pEVar6 + 1;
      }
      if (zP4 == (CollSeq *)0x0) {
        zP4 = pParse->db->pDfltColl;
      }
      if (iVar5 == 0) {
        if (pAggInfo->nAccumulator == 0) {
          iVar5 = 0;
        }
        else {
          iVar5 = pParse->nMem + 1;
          pParse->nMem = iVar5;
        }
      }
      sqlite3VdbeAddOp4(p,0x52,iVar5,0,0,(char *)zP4,-2);
    }
    sqlite3VdbeAddOp3(p,0x9a,0,local_54,pAVar2->iMem);
    sqlite3VdbeAppendP4(p,pAVar2->pFunc,-8);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)nReg & 0xff;
    }
    sqlite3ReleaseTempRange(pParse,local_54,nReg);
    if (addrRepeat != 0) {
      sqlite3VdbeResolveLabel(p,addrRepeat);
    }
    pAVar2 = pAVar2 + 1;
  }
  if (iVar5 == 0) {
    iVar1 = 0;
    if ((regAcc == 0) || (iVar5 = regAcc, iVar1 = 0, pAggInfo->nAccumulator == 0))
    goto LAB_0019bb78;
  }
  iVar1 = sqlite3VdbeAddOp1(p,0x12,iVar5);
LAB_0019bb78:
  ppEVar3 = &pAggInfo->aCol->pExpr;
  for (iVar5 = 0; iVar5 < pAggInfo->nAccumulator; iVar5 = iVar5 + 1) {
    sqlite3ExprCode(pParse,*ppEVar3,*(int *)((long)ppEVar3 + -4));
    ppEVar3 = ppEVar3 + 4;
  }
  pAggInfo->directMode = '\0';
  if (iVar1 == 0) {
    return;
  }
  sqlite3VdbeJumpHere(p,iVar1);
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, int regAcc, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(pParse);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}